

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O3

bool from_issue_342::test_uintwide_t_spot_values_from_issue_342_pos(void)

{
  uintwide_t<128U,_unsigned_int,_void,_false> local_58;
  uintwide_t<128U,_unsigned_int,_void,_false> local_48;
  uintwide_t<128U,_unsigned_int,_void,_false> local_38;
  
  local_38.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  local_38.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_38.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_48.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  local_48.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_48.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_38.values.super_array<unsigned_int,_4UL>.elems[0] = 0xb;
  local_48.values.super_array<unsigned_int,_4UL>.elems[0] = 3;
  local_58.values.super_array<unsigned_int,_4UL>.elems[0] = 0;
  local_58.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_58.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_58.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::eval_divide_knuth
            (&local_38,&local_48,&local_58);
  local_38.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  local_38.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_38.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_48.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  local_48.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_48.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_38.values.super_array<unsigned_int,_4UL>.elems[0] = 0xc;
  local_48.values.super_array<unsigned_int,_4UL>.elems[0] = 3;
  local_58.values.super_array<unsigned_int,_4UL>.elems[0] = 0;
  local_58.values.super_array<unsigned_int,_4UL>.elems[1] = 0;
  local_58.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  local_58.values.super_array<unsigned_int,_4UL>.elems[3] = 0;
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::eval_divide_knuth
            (&local_38,&local_48,&local_58);
  return true;
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_342_pos() -> bool
  {
    // See also: https://github.com/ckormanyos/wide-integer/issues/342

    #if defined(WIDE_INTEGER_NAMESPACE)
    using local_uint128_t = WIDE_INTEGER_NAMESPACE::math::wide_integer::uint128_t;
    #else
    using local_uint128_t = ::math::wide_integer::uint128_t;
    #endif

    auto result_is_ok = true;

    {
      const local_uint128_t a = 11;
      const local_uint128_t b =  3;

      const auto r_pp = divmod(+a, +b);

      const auto result_pp_is_ok = ((r_pp.first == +3) && (r_pp.second == +2));

      result_is_ok = (result_pp_is_ok && result_is_ok);
    }

    {
      const local_uint128_t a = 12;
      const local_uint128_t b =  3;

      const auto r_pp = divmod(+a, +b);

      const auto result_divmod_is_ok = ((r_pp.first == +4) && (r_pp.second == 0));

      result_is_ok = (result_divmod_is_ok && result_is_ok);
    }

    return result_is_ok;
  }